

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O2

void * matras_alloc_internal(matras *m)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  void *local_38;
  
  uVar1 = (uint)(m->head).block_count;
  bVar2 = (byte)m->shift1 & 0x1f;
  uVar7 = uVar1 >> bVar2;
  uVar3 = m->mask1 & uVar1;
  uVar9 = uVar3 >> ((byte)m->shift2 & 0x1f);
  uVar8 = m->mask2 & uVar3;
  if (uVar1 == 0) {
    local_38 = matras_alloc_extent(m);
    if (local_38 == (void *)0x0) {
      return (void *)0x0;
    }
    (m->head).root = local_38;
LAB_00105d3f:
    pvVar4 = matras_alloc_extent(m);
    if (pvVar4 == (void *)0x0) {
      if (uVar1 != 0) {
        return (void *)0x0;
      }
      goto LAB_00105dbd;
    }
    *(void **)((long)local_38 + (ulong)uVar7 * 8) = pvVar4;
    cVar6 = '\x01';
  }
  else {
    local_38 = (m->head).root;
    if (uVar3 == 0) goto LAB_00105d3f;
    pvVar4 = *(void **)((long)local_38 + (ulong)uVar7 * 8);
    cVar6 = (char)(0 >> bVar2);
  }
  if (uVar8 == 0) {
    pvVar5 = matras_alloc_extent(m);
    if (pvVar5 == (void *)0x0) {
      if (uVar1 == 0) {
        matras_free_extent(m,local_38);
      }
      local_38 = pvVar4;
      if (cVar6 == '\0') {
        return (void *)0x0;
      }
LAB_00105dbd:
      matras_free_extent(m,local_38);
      return (void *)0x0;
    }
    *(void **)((long)pvVar4 + (ulong)uVar9 * 8) = pvVar5;
  }
  else {
    pvVar5 = *(void **)((long)pvVar4 + (ulong)uVar9 * 8);
  }
  return (void *)((ulong)(uVar8 * m->block_size) + (long)pvVar5);
}

Assistant:

static void *
matras_alloc_internal(struct matras *m)
{
	/* Current block_count is the ID of new block */
	matras_id_t id = m->head.block_count;

	/* See "Shifts and masks explanation" for details */
	/* Additionally we determine if we must allocate extents.
	 * Basically,
	 * if n1 == 0 && n2 == 0 && n3 == 0, we must allocate root extent,
	 * if n2 == 0 && n3 == 0, we must allocate second level extent,
	 * if n3 == 0, we must allocate third level extent.
	 * Optimization:
	 * (n1 == 0 && n2 == 0 && n3 == 0) is identical to (id == 0)
	 * (n2 == 0 && n3 == 0) is identical to (id & mask1 == 0)
	 */
	matras_id_t extent1_available = id;
	matras_id_t n1 = id >> m->shift1;
	id &= m->mask1;
	matras_id_t extent2_available = id;
	matras_id_t n2 = id >> m->shift2;
	id &= m->mask2;
	matras_id_t extent3_available = id;
	matras_id_t n3 = id;

	void **extent1, **extent2;
	char *extent3;

	if (extent1_available) {
		extent1 = (void **)m->head.root;
	} else {
		extent1 = (void **)matras_alloc_extent(m);
		if (!extent1)
			return 0;
		m->head.root = (void *)extent1;
	}

	if (extent2_available) {
		extent2 = (void **)extent1[n1];
	} else {
		extent2 = (void **)matras_alloc_extent(m);
		if (!extent2) {
			if (!extent1_available) /* was created */
				matras_free_extent(m, extent1);
			return 0;
		}
		extent1[n1] = (void *)extent2;
	}

	if (extent3_available) {
		extent3 = (char *)extent2[n2];
	} else {
		extent3 = (char *)matras_alloc_extent(m);
		if (!extent3) {
			if (!extent1_available) /* was created */
				matras_free_extent(m, extent1);
			if (!extent2_available) /* was created */
				matras_free_extent(m, extent2);
			return 0;
		}
		extent2[n2] = (void *)extent3;
	}

	return (void *)(extent3 + n3 * m->block_size);
}